

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

BOOL UnmapViewOfFile(LPCVOID lpBaseAddress)

{
  PAL_ERROR PVar1;
  CPalThread *pThread;
  PAL_ERROR *pPVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    PVar1 = CorUnix::InternalUnmapViewOfFile(pThread,lpBaseAddress);
    if (PVar1 != 0) {
      pPVar2 = (PAL_ERROR *)__errno_location();
      *pPVar2 = PVar1;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return (BOOL)(PVar1 == 0);
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
UnmapViewOfFile(
        IN LPCVOID lpBaseAddress)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    
    PERF_ENTRY(UnmapViewOfFile);
    ENTRY("UnmapViewOfFile(lpBaseAddress=%p)\n", lpBaseAddress);

    pThread = InternalGetCurrentThread();

    palError = InternalUnmapViewOfFile(pThread, lpBaseAddress);

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }
    
    LOGEXIT( "UnmapViewOfFile returning %s.\n", (NO_ERROR == palError) ? "TRUE" : "FALSE" );
    PERF_EXIT(UnmapViewOfFile);
    return (NO_ERROR == palError);
}